

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteCollectionFetchRecordById(unqlite_col *pCol,jx9_int64 nId,jx9_value *pValue)

{
  SyBlob *pBlob;
  sxu32 nByte;
  int iVar1;
  unqlite_col_record *puVar2;
  
  jx9MemObjRelease(pValue);
  puVar2 = CollectionCacheFetchRecord(pCol,nId);
  if (puVar2 == (unqlite_col_record *)0x0) {
    pBlob = &pCol->sWorker;
    SyBlobReset(pBlob);
    SyBlobFormat(pBlob,"%z_%qd",&pCol->sName,nId);
    unqlite_kv_cursor_reset(pCol->pCursor);
    iVar1 = unqlite_kv_cursor_seek(pCol->pCursor,(pCol->sWorker).pBlob,(pCol->sWorker).nByte,1);
    if (iVar1 == 0) {
      SyBlobReset(pBlob);
      (*pCol->pCursor->pStore->pIo->pMethods->xData)(pCol->pCursor,unqliteDataConsumer,pBlob);
      nByte = (pCol->sWorker).nByte;
      if (nByte == 0) {
        iVar1 = 0;
        unqliteGenErrorFormat(pCol->pVm->pDb,"Empty record \'%qd\'",nId);
        jx9MemObjRelease(pValue);
      }
      else {
        iVar1 = FastJsonDecode((pCol->sWorker).pBlob,nByte,pValue,(uchar **)0x0,0);
        if (iVar1 == 0) {
          CollectionCacheInstallRecord(pCol,nId,pValue);
          iVar1 = 0;
        }
      }
    }
  }
  else {
    jx9MemObjStore(&puVar2->sValue,pValue);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionFetchRecordById(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId,     /* Unique record ID */
	jx9_value *pValue  /* OUT: record value */
	)
{
	SyBlob *pWorker = &pCol->sWorker;
	unqlite_col_record *pRec;
	int rc;
	jx9_value_null(pValue);
	/* Perform a cache lookup first */
	pRec = CollectionCacheFetchRecord(pCol,nId);
	if( pRec ){
		/* Copy record value */
		jx9MemObjStore(&pRec->sValue,pValue);
		return UNQLITE_OK;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Generate the unique ID */
	SyBlobFormat(pWorker,"%z_%qd",&pCol->sName,nId);
	/* Reset the cursor */
	unqlite_kv_cursor_reset(pCol->pCursor);
	/* Seek the cursor to the desired location */
	rc = unqlite_kv_cursor_seek(pCol->pCursor,
		SyBlobData(pWorker),SyBlobLength(pWorker),
		UNQLITE_CURSOR_MATCH_EXACT
		);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Consume the binary JSON */
	SyBlobReset(pWorker);
	unqlite_kv_cursor_data_callback(pCol->pCursor,unqliteDataConsumer,pWorker);
	if( SyBlobLength(pWorker) < 1 ){
		unqliteGenErrorFormat(pCol->pVm->pDb,
			"Empty record '%qd'",nId
			);
		jx9_value_null(pValue);
	}else{
		/* Decode the binary JSON */
		rc = FastJsonDecode(SyBlobData(pWorker),SyBlobLength(pWorker),pValue,0,0);
		if( rc == UNQLITE_OK ){
			/* Install the record in the cache */
			CollectionCacheInstallRecord(pCol,nId,pValue);
		}
	}
	return rc;
}